

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.h
# Opt level: O1

void __thiscall
Js::JSONStringifier::PropertyListElement::PropertyListElement
          (PropertyListElement *this,PropertyListElement *other)

{
  PropertyRecord *pPVar1;
  JavascriptString *pJVar2;
  
  pPVar1 = (other->propertyRecord).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->propertyRecord).ptr = pPVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  pJVar2 = (other->propertyName).ptr;
  Memory::Recycler::WBSetBit((char *)&this->propertyName);
  (this->propertyName).ptr = pJVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->propertyName);
  return;
}

Assistant:

PropertyListElement(const PropertyListElement& other)
            : propertyRecord(other.propertyRecord), propertyName(other.propertyName)
        {}